

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompactCounters.h
# Opt level: O3

void __thiscall
Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::AllocCounters<unsigned_int>
          (CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields> *this,
          FunctionBody *host)

{
  Type TVar1;
  Fields *pFVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  ThreadContext *pTVar6;
  undefined4 *puVar7;
  Recycler *pRVar8;
  Fields *pFVar9;
  long lVar10;
  Type *addr;
  CriticalSection *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pTVar6 = ThreadContext::GetContextForCurrentThread();
  if (pTVar6 == (ThreadContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CompactCounters.h"
                                ,0x98,"(ThreadContext::GetContextForCurrentThread())",
                                "ThreadContext::GetContextForCurrentThread()");
    if (!bVar4) goto LAB_0077a7fa;
    *puVar7 = 0;
  }
  pRVar8 = ((host->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
  if (pRVar8 == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CompactCounters.h"
                                ,0x99,"(host->GetRecycler() != nullptr)",
                                "host->GetRecycler() != nullptr");
    if (!bVar4) goto LAB_0077a7fa;
    *puVar7 = 0;
    pRVar8 = ((host->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
  }
  local_50 = (undefined1  [8])&unsigned_int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0x6c;
  data.count = (size_t)anon_var_dwarf_2accd01;
  data.filename._0_4_ = 0x9d;
  pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,(TrackAllocData *)local_50);
  BVar5 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar4) goto LAB_0077a7fa;
    *puVar7 = 0;
  }
  pFVar9 = (Fields *)
           Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>(pRVar8,0x1b0)
  ;
  if (pFVar9 == (Fields *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar4) goto LAB_0077a7fa;
    *puVar7 = 0;
  }
  TVar1 = this->fieldSize;
  if (TVar1 != '\0') {
    pFVar2 = (host->counters).fields.ptr;
    if (TVar1 == '\x01') {
      lVar10 = 0;
      do {
        *(uint *)(pFVar9 + lVar10 * 4) = (uint)(byte)pFVar2[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x1b);
    }
    else if (TVar1 == '\x02') {
      lVar10 = 0;
      do {
        *(uint *)(pFVar9 + lVar10 * 4) = (uint)*(ushort *)(pFVar2 + lVar10 * 2);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x1b);
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CompactCounters.h"
                                  ,0xba,"(this->fieldSize==0)","this->fieldSize==0");
      if (!bVar4) {
LAB_0077a7fa:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    if (this->fieldSize != '\0') {
      this_00 = &((host->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                 threadContext->csFunctionBody;
      CCLock::Enter(&this_00->super_CCLock);
      this->fieldSize = '\x04';
      addr = &this->fields;
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = pFVar9;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      CCLock::Leave(&this_00->super_CCLock);
      return;
    }
  }
  this->fieldSize = '\x04';
  Memory::Recycler::WBSetBit((char *)&this->fields);
  (this->fields).ptr = pFVar9;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->fields);
  return;
}

Assistant:

void AllocCounters(T* host)
        {
            // only allow expanding in foreground thread. while function body cleanup 
            // we may set counters to 0 but that would not lead to expanding
            Assert(ThreadContext::GetContextForCurrentThread());
            Assert(host->GetRecycler() != nullptr);

            const uint8 max = static_cast<uint8>(CountT::Max);
            typedef CompactCounters<T, CountT> CounterT;
            CounterT::Fields* fieldsArray = (CounterT::Fields*)RecyclerNewArrayLeafZ(host->GetRecycler(), FieldT, sizeof(FieldT)*max);
            CounterT::Fields* oldFieldsArray = host->counters.fields;
            uint8 i = 0;
            if (this->fieldSize == 1)
            {
                if (sizeof(FieldT) == 2)
                {
                    for (; i < max; i++)
                    {
                        fieldsArray->u16Fields[i] = oldFieldsArray->u8Fields[i];
                    }
                }
                else if (sizeof(FieldT) == 4)
                {
                    for (; i < max; i++)
                    {
                        fieldsArray->u32Fields[i] = oldFieldsArray->u8Fields[i];
                    }
                }
            }
            else if (this->fieldSize == 2)
            {
                for (; i < max; i++)
                {
                    fieldsArray->u32Fields[i] = oldFieldsArray->u16Fields[i];
                }
            }
            else
            {
                Assert(this->fieldSize==0);
            }

            if (this->fieldSize == 0)
            {
                this->fieldSize = sizeof(FieldT);
                this->fields = fieldsArray;
            }
            else
            {
                AutoCriticalSection autoCS(host->GetScriptContext()->GetThreadContext()->GetFunctionBodyLock());
                this->fieldSize = sizeof(FieldT);
                this->fields = fieldsArray;
            }
        }